

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::assign(CImgList<unsigned_char> *this)

{
  CImg<unsigned_char> *pCVar1;
  uchar *puVar2;
  CImg<unsigned_char> *pCVar3;
  CImgList<unsigned_char> *in_RDI;
  CImg<unsigned_char> *this_00;
  
  pCVar1 = in_RDI->_data;
  if (pCVar1 != (CImg<unsigned_char> *)0x0) {
    this_00 = (CImg<unsigned_char> *)&pCVar1[-1]._data;
    puVar2 = pCVar1[-1]._data;
    for (pCVar3 = pCVar1 + (long)puVar2; pCVar1 != pCVar3; pCVar3 = pCVar3 + -1) {
      CImg<unsigned_char>::~CImg(this_00);
    }
    operator_delete__(this_00,(long)puVar2 * 0x20 + 8);
  }
  in_RDI->_allocated_width = 0;
  in_RDI->_width = 0;
  in_RDI->_data = (CImg<unsigned_char> *)0x0;
  return in_RDI;
}

Assistant:

CImgList<T>& assign() {
      delete[] _data;
      _width = _allocated_width = 0;
      _data = 0;
      return *this;
    }